

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# option-parser.cc
# Opt level: O0

void __thiscall
wabt::OptionParser::AddOption(OptionParser *this,char *long_name,char *help,NullCallback *callback)

{
  function<void_()> local_168;
  Callback local_148;
  allocator local_121;
  string local_120;
  string local_100;
  allocator local_d9;
  string local_d8;
  undefined1 local_b8 [8];
  Option option;
  NullCallback *callback_local;
  char *help_local;
  char *long_name_local;
  OptionParser *this_local;
  
  option.callback._M_invoker = (_Invoker_type)callback;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_d8,long_name,&local_d9);
  std::__cxx11::string::string((string *)&local_100);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_120,help,&local_121);
  std::function<void_()>::function(&local_168,(function<void_()> *)option.callback._M_invoker);
  std::function<void(char_const*)>::
  function<wabt::OptionParser::AddOption(char_const*,char_const*,std::function<void()>const&)::__0,void>
            ((function<void(char_const*)> *)&local_148,(anon_class_32_1_dda845c3 *)&local_168);
  Option::Option((Option *)local_b8,'\0',&local_d8,&local_100,No,&local_120,&local_148);
  std::function<void_(const_char_*)>::~function(&local_148);
  AddOption(char_const*,char_const*,std::function<void()>const&)::$_0::~__0((__0 *)&local_168);
  std::__cxx11::string::~string((string *)&local_120);
  std::allocator<char>::~allocator((allocator<char> *)&local_121);
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::~string((string *)&local_d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_d9);
  AddOption(this,(Option *)local_b8);
  Option::~Option((Option *)local_b8);
  return;
}

Assistant:

void OptionParser::AddOption(const char* long_name,
                             const char* help,
                             const NullCallback& callback) {
  Option option('\0', long_name, std::string(), HasArgument::No, help,
                [callback](const char*) { callback(); });
  AddOption(option);
}